

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

ostream * despot::operator<<(ostream *os,vector<double,_std::allocator<double>_> *vec)

{
  size_type sVar1;
  ostream *this;
  reference pvVar2;
  char *pcVar3;
  int local_1c;
  int i;
  vector<double,_std::allocator<double>_> *vec_local;
  ostream *os_local;
  
  std::operator<<(os,"[");
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(vec);
    if (sVar1 <= (ulong)(long)local_1c) break;
    pcVar3 = ", ";
    if (local_1c == 0) {
      pcVar3 = "";
    }
    this = std::operator<<(os,pcVar3);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](vec,(long)local_1c);
    std::ostream::operator<<(this,*pvVar2);
    local_1c = local_1c + 1;
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, std::vector<T> vec) {
	os << "[";
	for (int i = 0; i < vec.size(); i++)
		os << (i == 0 ? "" : ", ") << vec[i];
	os << "]";
	return os;
}